

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Meteomatics_Internals.h
# Opt level: O2

MemoryClass * __thiscall MMIntern::MemoryClass::operator>>(MemoryClass *this,float *v)

{
  pointer pcVar1;
  
  pcVar1 = (this->mem).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (this->readPos + 4 <=
      (ulong)((long)(this->mem).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pcVar1)) {
    *v = *(float *)(pcVar1 + this->readPos);
    this->readPos = this->readPos + 4;
  }
  return this;
}

Assistant:

MMIntern::MemoryClass& MMIntern::MemoryClass::operator>>(T& v)
{
    constexpr std::size_t typeSize = sizeof(T);
    
    if (readPos + typeSize > mem.size())                // in case reading exceeds mem blocks...
    {                                                   //   (maybe cout something)
        return *this;
    }
    
    std::copy(mem.begin() + readPos, mem.begin() + readPos + typeSize, reinterpret_cast<char*>(&v)); 
    readPos += typeSize;
    return *this;
}